

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O3

void lddmc_fprintdot_unmark(MDD mdd)

{
  long lVar1;
  ulong uVar2;
  uint8_t *puVar3;
  
  if (1 < mdd) {
    lVar1 = mdd * 0x10;
    puVar3 = nodes->data;
    if ((*(ulong *)(puVar3 + lVar1) & 1) != 0) {
      *(ulong *)(puVar3 + lVar1) = *(ulong *)(puVar3 + lVar1) & 0xfffffffffffffffe;
      while( true ) {
        lddmc_fprintdot_unmark(*(ulong *)(puVar3 + lVar1 + 8) >> 0x11);
        uVar2 = *(ulong *)(puVar3 + lVar1) >> 1 & 0x7fffffffffff;
        if (uVar2 == 0) break;
        lVar1 = uVar2 << 4;
        puVar3 = nodes->data;
      }
    }
  }
  return;
}

Assistant:

static void
lddmc_fprintdot_unmark(MDD mdd)
{
    if (mdd <= lddmc_true) return;
    mddnode_t n = LDD_GETNODE(mdd);
    if (mddnode_getmark(n)) {
        mddnode_setmark(n, 0);
        for (;;) {
            lddmc_fprintdot_unmark(mddnode_getdown(n));
            mdd = mddnode_getright(n);
            if (mdd == lddmc_false) return;
            n = LDD_GETNODE(mdd);
        }
    }
}